

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall duckdb::Value::Value(Value *this,string *val)

{
  bool bVar1;
  InvalidInputException *__return_storage_ptr__;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  LogicalType::LogicalType(&this->type_,VARCHAR);
  this->is_null = false;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = StringIsValid((val->_M_dataplus)._M_p,val->_M_string_length);
  if (bVar1) {
    make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string>(&local_40);
    shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::StringValueInfo,_0>
              (&this->value_info_,(shared_ptr<duckdb::StringValueInfo,_true> *)&local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
    return;
  }
  __return_storage_ptr__ = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"value construction",&local_41);
  ErrorManager::InvalidUnicodeError(__return_storage_ptr__,val,&local_40);
  __cxa_throw(__return_storage_ptr__,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

Value::Value(string val) : type_(LogicalType::VARCHAR), is_null(false) {
	if (!Value::StringIsValid(val.c_str(), val.size())) {
		throw ErrorManager::InvalidUnicodeError(val, "value construction");
	}
	value_info_ = make_shared_ptr<StringValueInfo>(std::move(val));
}